

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnyURIDatatypeValidator.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::AnyURIDatatypeValidator::encode
          (AnyURIDatatypeValidator *this,XMLCh *content,XMLSize_t len,XMLBuffer *encoded,
          MemoryManager *manager)

{
  byte bVar1;
  XMLCh XVar2;
  char cVar3;
  XMLByte *pXVar4;
  MemoryManager *manager_00;
  int iVar5;
  undefined4 extraout_var;
  XMLSize_t XVar6;
  XMLCh *pXVar7;
  XMLSize_t XVar8;
  XMLSize_t XVar9;
  XMLSize_t XVar10;
  long lVar11;
  XMLSize_t XVar12;
  char tempStr_1 [3];
  char tempStr [3];
  XMLSize_t charsEaten;
  char local_6c [4];
  XMLByte *local_68;
  MemoryManager *local_60;
  XMLUTF8Transcoder local_58;
  XMLSize_t local_38;
  
  if (len != 0) {
    lVar11 = 0;
    local_68 = (XMLByte *)len;
    local_60 = manager;
    do {
      manager_00 = local_60;
      XVar2 = *content;
      if (0x7f < (ushort)XVar2) {
        XVar12 = (long)local_68 * 4 - lVar11;
        XVar6 = XVar12 + 1;
        iVar5 = (*local_60->_vptr_MemoryManager[3])(local_60,XVar6);
        local_68 = (XMLByte *)CONCAT44(extraout_var,iVar5);
        XMLUTF8Transcoder::XMLUTF8Transcoder(&local_58,L"UTF-8",XVar6,manager_00);
        pXVar4 = local_68;
        XVar6 = XMLUTF8Transcoder::transcodeTo
                          (&local_58,content,len,local_68,XVar12,&local_38,UnRep_RepChar);
        if (local_38 == len) {
          if (XVar6 != 0) {
            XVar12 = 0;
            do {
              bVar1 = pXVar4[XVar12];
              if (((char)bVar1 < '\0') || (encode::needEscapeMap[bVar1] == true)) {
                local_6c[2] = 0;
                local_6c[0] = '\0';
                local_6c[1] = '\0';
                sprintf(local_6c,"%02X");
                XVar8 = encoded->fIndex;
                XVar9 = encoded->fCapacity;
                if (XVar8 == XVar9) {
                  XMLBuffer::ensureCapacity(encoded,1);
                  XVar8 = encoded->fIndex;
                  XVar9 = encoded->fCapacity;
                }
                pXVar7 = encoded->fBuffer;
                XVar10 = XVar8 + 1;
                encoded->fIndex = XVar10;
                pXVar7[XVar8] = L'%';
                cVar3 = local_6c[0];
                if (XVar10 == XVar9) {
                  XMLBuffer::ensureCapacity(encoded,1);
                  XVar10 = encoded->fIndex;
                  XVar9 = encoded->fCapacity;
                  pXVar7 = encoded->fBuffer;
                }
                XVar8 = XVar10 + 1;
                encoded->fIndex = XVar8;
                pXVar7[XVar10] = (short)cVar3;
                cVar3 = local_6c[1];
                if (XVar8 == XVar9) {
                  XMLBuffer::ensureCapacity(encoded,1);
                  XVar8 = encoded->fIndex;
                  pXVar7 = encoded->fBuffer;
                }
                encoded->fIndex = XVar8 + 1;
                pXVar7[XVar8] = (short)cVar3;
              }
              else {
                XVar8 = encoded->fIndex;
                if (XVar8 == encoded->fCapacity) {
                  XMLBuffer::ensureCapacity(encoded,1);
                  XVar8 = encoded->fIndex;
                }
                encoded->fIndex = XVar8 + 1;
                encoded->fBuffer[XVar8] = (short)(char)bVar1;
              }
              XVar12 = XVar12 + 1;
            } while (XVar6 != XVar12);
          }
          (*local_60->_vptr_MemoryManager[4])(local_60,pXVar4);
          XMLUTF8Transcoder::~XMLUTF8Transcoder(&local_58);
          return;
        }
        __assert_fail("charsEaten == remContentLen",
                      "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AnyURIDatatypeValidator.cpp"
                      ,0xa2,
                      "void xercesc_4_0::AnyURIDatatypeValidator::encode(const XMLCh *const, const XMLSize_t, XMLBuffer &, MemoryManager *const)"
                     );
      }
      if (encode::needEscapeMap[(ushort)XVar2] == true) {
        local_58.super_XMLTranscoder._vptr_XMLTranscoder._2_1_ = 0;
        local_58.super_XMLTranscoder._vptr_XMLTranscoder._0_2_ = 0;
        sprintf((char *)&local_58,"%02X",(ulong)(uint)(ushort)XVar2);
        XVar6 = encoded->fIndex;
        XVar12 = encoded->fCapacity;
        if (XVar6 == XVar12) {
          XMLBuffer::ensureCapacity(encoded,1);
          XVar6 = encoded->fIndex;
          XVar12 = encoded->fCapacity;
        }
        pXVar7 = encoded->fBuffer;
        XVar8 = XVar6 + 1;
        encoded->fIndex = XVar8;
        pXVar7[XVar6] = L'%';
        cVar3 = (char)local_58.super_XMLTranscoder._vptr_XMLTranscoder;
        if (XVar8 == XVar12) {
          XMLBuffer::ensureCapacity(encoded,1);
          XVar8 = encoded->fIndex;
          XVar12 = encoded->fCapacity;
          pXVar7 = encoded->fBuffer;
        }
        XVar6 = XVar8 + 1;
        encoded->fIndex = XVar6;
        pXVar7[XVar8] = (short)cVar3;
        cVar3 = local_58.super_XMLTranscoder._vptr_XMLTranscoder._1_1_;
        if (XVar6 == XVar12) {
          XMLBuffer::ensureCapacity(encoded,1);
          XVar6 = encoded->fIndex;
          pXVar7 = encoded->fBuffer;
        }
        encoded->fIndex = XVar6 + 1;
        pXVar7[XVar6] = (short)cVar3;
      }
      else {
        XVar6 = encoded->fIndex;
        if (XVar6 == encoded->fCapacity) {
          XMLBuffer::ensureCapacity(encoded,1);
          XVar6 = encoded->fIndex;
        }
        encoded->fIndex = XVar6 + 1;
        encoded->fBuffer[XVar6] = XVar2;
      }
      content = content + 1;
      lVar11 = lVar11 + 4;
      len = len - 1;
    } while (len != 0);
  }
  return;
}

Assistant:

void AnyURIDatatypeValidator::encode(const XMLCh* const content, const XMLSize_t len, XMLBuffer& encoded, MemoryManager* const manager)
{
    static const bool needEscapeMap[] = {
        true , true , true , true , true , true , true , true , true , true , true , true , true , true , true , true , /* 0x00 to 0x0F need escape */
        true , true , true , true , true , true , true , true , true , true , true , true , true , true , true , true , /* 0x10 to 0x1F need escape */
        true , false, true , false, false, false, false, false, false, false, false, false, false, false, false, false, /* 0x20:' ', 0x22:'"' */
        false, false, false, false, false, false, false, false, false, false, false, false, true , false, true , false, /* 0x3C:'<', 0x3E:'>' */
        false, false, false, false, false, false, false, false, false, false, false, false, false, false, false, false,
        false, false, false, false, false, false, false, false, false, false, false, false, true , false, true , false, /* 0x5C:'\\', 0x5E:'^' */
        true , false, false, false, false, false, false, false, false, false, false, false, false, false, false, false, /* 0x60:'`' */
        false, false, false, false, false, false, false, false, false, false, false, true , true , true , true , true   /* 0x7B:'{', 0x7C:'|', 0x7D:'}', 0x7E:'~', 0x7F:DEL */
    };

    // For each character in content
    XMLSize_t i;
    for (i = 0; i < len; i++)
    {
        int ch = (int)content[i];
        // If it's not an ASCII character, break here, and use UTF-8 encoding
        if (ch >= 128)
            break;

        if (needEscapeMap[ch])
        {
            char tempStr[3] = "\0";
            sprintf(tempStr, "%02X", ch);
            encoded.append('%');
            encoded.append((XMLCh)tempStr[0]);
            encoded.append((XMLCh)tempStr[1]);
        }
        else
        {
            encoded.append((XMLCh)ch);
        }
    }

    // we saw some non-ascii character
    if (i < len) {
        // get UTF-8 bytes for the remaining sub-string
        const XMLCh* remContent = (XMLCh*)&content[i];
        const XMLSize_t remContentLen = len - i;
        XMLByte* UTF8Byte = (XMLByte*)manager->allocate((remContentLen*4+1) * sizeof(XMLByte));
        XMLSize_t charsEaten;

        XMLUTF8Transcoder transcoder(XMLUni::fgUTF8EncodingString, remContentLen*4+1, manager);
        XMLSize_t utf8Len = transcoder.transcodeTo(remContent, remContentLen, UTF8Byte, remContentLen*4, charsEaten, XMLTranscoder::UnRep_RepChar);
        assert(charsEaten == remContentLen);

        XMLSize_t j;
        for (j = 0; j < utf8Len; j++) {
            XMLByte b = UTF8Byte[j];
            if (b >= 128 || needEscapeMap[b])
            {
                char tempStr[3] = "\0";
                sprintf(tempStr, "%02X", b);
                encoded.append('%');
                encoded.append((XMLCh)tempStr[0]);
                encoded.append((XMLCh)tempStr[1]);
            }
            else
            {
                encoded.append((XMLCh)b);
            }
        }
        manager->deallocate(UTF8Byte);
    }
}